

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::addSaturateSI8x16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  Literal *val;
  long lVar1;
  Literal *this_00;
  undefined1 local_340 [8];
  LaneArray<16> other_lanes;
  LaneArray<16> lanes;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)&other_lanes._M_elems[0xf].type,(wasm *)this,other);
  getLanes<unsigned_char,16>((LaneArray<16> *)local_340,(wasm *)other,val);
  __return_storage_ptr___00 = &lanes._M_elems[0xf].type;
  for (lVar1 = 0; lVar1 != 0x180; lVar1 = lVar1 + 0x18) {
    this_00 = (Literal *)((long)lanes._M_elems + lVar1 + -8);
    addSatSI8((Literal *)__return_storage_ptr___00,this_00,(Literal *)(local_340 + lVar1));
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
  }
  Literal(__return_storage_ptr__,(LaneArray<16> *)&other_lanes._M_elems[0xf].type);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_340);
  std::array<wasm::Literal,_16UL>::~array
            ((array<wasm::Literal,_16UL> *)&other_lanes._M_elems[0xf].type);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::addSaturateSI8x16(const Literal& other) const {
  return binary<16, &Literal::getLanesUI8x16, &Literal::addSatSI8>(*this,
                                                                   other);
}